

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

avector<AffineSpace3ff> * __thiscall
embree::XMLLoader::loadQuaternionArray
          (avector<AffineSpace3ff> *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Vector *pVVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _Base_ptr p_Var8;
  size_t sVar9;
  pointer pRVar10;
  pointer pRVar11;
  pointer pRVar12;
  pointer pTVar13;
  bool bVar14;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar15;
  long lVar16;
  runtime_error *this_00;
  ulong uVar17;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *ptr;
  ulong uVar18;
  XMLLoader *this_01;
  ulong uVar19;
  ulong local_f8;
  Ref<embree::XML> child;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_78;
  _Base_ptr local_68;
  size_t sStack_60;
  pointer local_58;
  pointer pRStack_50;
  pointer local_48;
  pointer pTStack_40;
  
  if (xml->ptr == (XML *)0x0) {
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
  }
  else {
    bVar14 = std::operator==(&xml->ptr->name,"QuaternionArray");
    if (!bVar14) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ParseLocation::str_abi_cxx11_((string *)&child,&xml->ptr->loc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_78.field_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child,
                     ": invalid Quaternion array");
      std::runtime_error::runtime_error(this_00,(string *)&local_78.field_1);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    ptr = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
    local_f8 = 0;
    uVar18 = 0;
    while (this_01 = (XMLLoader *)xml->ptr,
          uVar18 < (ulong)((long)((this_01->id2node)._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count -
                                 (long)(this_01->id2node)._M_t._M_impl.super__Rb_tree_header.
                                       _M_header._M_right) >> 3)) {
      XML::child((XML *)&child,(size_t)this_01);
      loadQuaternion((AffineSpace3ff *)&local_78.field_1,this_01,&child);
      pTVar13 = pTStack_40;
      pRVar12 = local_48;
      pRVar11 = pRStack_50;
      pRVar10 = local_58;
      sVar9 = sStack_60;
      p_Var8 = local_68;
      uVar7 = local_78._8_8_;
      uVar6 = local_78._0_8_;
      uVar1 = uVar18 + 1;
      if (local_f8 <= uVar18) {
        uVar17 = local_f8;
        uVar19 = uVar1;
        if (local_f8 != 0) {
          for (; uVar19 = uVar17, uVar17 <= uVar18; uVar17 = uVar17 * 2 + (ulong)(uVar17 * 2 == 0))
          {
          }
        }
        if (local_f8 != uVar19) {
          pAVar15 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    alignedMalloc(uVar19 << 6,0x10);
          lVar16 = 0x30;
          uVar17 = uVar18;
          while (bVar14 = uVar17 != 0, uVar17 = uVar17 - 1, bVar14) {
            puVar2 = (undefined8 *)((long)ptr + lVar16 + -0x30);
            uVar5 = puVar2[1];
            puVar3 = (undefined8 *)((long)pAVar15 + lVar16 + -0x30);
            *puVar3 = *puVar2;
            puVar3[1] = uVar5;
            puVar2 = (undefined8 *)((long)ptr + lVar16 + -0x20);
            uVar5 = puVar2[1];
            puVar3 = (undefined8 *)((long)pAVar15 + lVar16 + -0x20);
            *puVar3 = *puVar2;
            puVar3[1] = uVar5;
            puVar2 = (undefined8 *)((long)ptr + lVar16 + -0x10);
            uVar5 = puVar2[1];
            puVar3 = (undefined8 *)((long)pAVar15 + lVar16 + -0x10);
            *puVar3 = *puVar2;
            puVar3[1] = uVar5;
            puVar2 = (undefined8 *)((long)&(ptr->l).vx.field_0 + lVar16);
            uVar5 = puVar2[1];
            puVar3 = (undefined8 *)((long)&(pAVar15->l).vx.field_0 + lVar16);
            *puVar3 = *puVar2;
            puVar3[1] = uVar5;
            lVar16 = lVar16 + 0x40;
          }
          alignedFree(ptr);
          local_f8 = uVar19;
          ptr = pAVar15;
        }
      }
      *(undefined8 *)&ptr[uVar18].l.vx.field_0 = uVar6;
      *(undefined8 *)((long)&ptr[uVar18].l.vx.field_0 + 8) = uVar7;
      pVVar4 = &ptr[uVar18].l.vy;
      *(_Base_ptr *)&pVVar4->field_0 = p_Var8;
      *(size_t *)((long)&pVVar4->field_0 + 8) = sVar9;
      pVVar4 = &ptr[uVar18].l.vz;
      *(pointer *)&pVVar4->field_0 = pRVar10;
      *(pointer *)((long)&pVVar4->field_0 + 8) = pRVar11;
      local_b8 = SUB84(pRVar12,0);
      fStack_b4 = (float)((ulong)pRVar12 >> 0x20);
      fStack_b0 = SUB84(pTVar13,0);
      fStack_ac = (float)((ulong)pTVar13 >> 0x20);
      pVVar4 = &ptr[uVar18].p;
      (pVVar4->field_0).m128[0] = local_b8;
      (pVVar4->field_0).m128[1] = fStack_b4;
      (pVVar4->field_0).m128[2] = fStack_b0;
      (pVVar4->field_0).m128[3] = fStack_ac;
      uVar18 = uVar1;
      if (child.ptr != (XML *)0x0) {
        (*((child.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    __return_storage_ptr__->size_active = uVar18;
    __return_storage_ptr__->size_alloced = local_f8;
    __return_storage_ptr__->items = ptr;
  }
  return __return_storage_ptr__;
}

Assistant:

avector<AffineSpace3ff> XMLLoader::loadQuaternionArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<AffineSpace3ff>();

    if (xml->name == "QuaternionArray") {
      avector<AffineSpace3ff> spaceArray;
      for (size_t i = 0; i < xml->size(); ++i) {
        auto child = xml->child(i);
        spaceArray.push_back(loadQuaternion(child));
      }
      return spaceArray;
    }
    else
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid Quaternion array");
  }